

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initPreLinkEventTools(VcprojGenerator *this)

{
  QMakeProject *this_00;
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  ProStringList *pPVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_58,"QMAKE_PRE_LINK");
  pPVar5 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)local_58);
  lVar1 = (pPVar5->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_58);
  if (lVar1 != 0) {
    local_78.size = -0x5555555555555556;
    local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_58,"QMAKE_PRE_LINK");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_90,this,local_58);
    VCToolBase::fixCommandLine((QStringList *)&local_78,(QString *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_58);
    QArrayDataPointer<QString>::operator=
              (&(this->vcProject).Configuration.preLink.super_VCEventTool.CommandLine.d,&local_78);
    QtPrivate::lengthHelperPointer<char>("\r\n");
    QtPrivate::QStringList_join((QList *)local_58,(QLatin1String *)&local_78);
    pDVar3 = (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.d;
    pcVar4 = (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.ptr;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.d = local_58[0].d;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.ptr = local_58[0].ptr;
    qVar2 = (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.size;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.size = local_58[0].size;
    local_58[0].d = pDVar3;
    local_58[0].ptr = pcVar4;
    local_58[0].size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_58);
    (this->vcProject).Configuration.preLink.super_VCEventTool.ExcludedFromBuild = _False;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initPreLinkEventTools()
{
    VCConfiguration &conf = vcProject.Configuration;
    if(!project->values("QMAKE_PRE_LINK").isEmpty()) {
        QStringList cmdline = VCToolBase::fixCommandLine(var("QMAKE_PRE_LINK"));
        conf.preLink.CommandLine = cmdline;
        conf.preLink.Description = cmdline.join(QLatin1String("\r\n"));
        conf.preLink.ExcludedFromBuild = _False;
    }
}